

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation_p.h
# Opt level: O0

void __thiscall QAbstractAnimationPrivate::emitCurrentLoopChanged(QAbstractAnimationPrivate *this)

{
  QAbstractAnimationPrivate *in_RDI;
  int _t1;
  
  q_func(in_RDI);
  _t1 = (int)((ulong)in_RDI >> 0x20);
  ::QObjectCompatProperty::operator_cast_to_int
            ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
              *)0x66e760);
  QAbstractAnimation::currentLoopChanged((QAbstractAnimation *)0x66e76c,_t1);
  return;
}

Assistant:

Q_OBJECT_COMPAT_PROPERTY_WITH_ARGS(QAbstractAnimationPrivate, int, currentLoop, nullptr,
                                       &QAbstractAnimationPrivate::emitCurrentLoopChanged, 0)

    bool deleteWhenStopped = false;
    bool hasRegisteredTimer = false;
    bool isPause = false;
    bool isGroup = false;

    QAnimationGroup *group = nullptr;

private:
    Q_DECLARE_PUBLIC(QAbstractAnimation)
};


class QUnifiedTimer;
class QDefaultAnimationDriver : public QAnimationDriver
{
    Q_OBJECT
public:
    explicit QDefaultAnimationDriver(QUnifiedTimer *timer);
    ~QDefaultAnimationDriver() override;

protected:
    void timerEvent(QTimerEvent *e) override;

private Q_SLOTS:
    void startTimer();
    void stopTimer();

private:
    QBasicTimer m_timer;
    QUnifiedTimer *m_unified_timer;
};

class Q_CORE_EXPORT QAnimationDriverPrivate : public QObjectPrivate
{
public:
    QAnimationDriverPrivate();
    ~QAnimationDriverPrivate() override;

    QElapsedTimer timer;
    bool running = false;
}